

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Constant * __thiscall
soul::PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value>
          (PoolAllocator *this,CodeLocation *args,Value *args_1)

{
  PoolItem *pPVar1;
  CodeLocation local_68;
  Value local_58;
  
  pPVar1 = allocateSpaceForObject(this,0x58);
  local_68.sourceCode.object = (args->sourceCode).object;
  if (local_68.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_68.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_68.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_68.location.data = (args->location).data;
  soul::Value::Value(&local_58,args_1);
  heart::Constant::Constant((Constant *)&pPVar1->item,&local_68,&local_58);
  soul::Value::~Value(&local_58);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_68.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::Constant,_soul::CodeLocation_&,_soul::Value>::anon_class_1_0_00000001::
       __invoke;
  return (Constant *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }